

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  bool bVar1;
  cmState *this_00;
  cmMakefile *pcVar2;
  cmGlobalGenerator *this_01;
  cmInstallSubdirectoryGenerator *this_02;
  char *binaryDirectory;
  bool local_121;
  allocator<char> local_f1;
  string local_f0;
  byte local_cb;
  byte local_ca;
  allocator<char> local_c9;
  string local_c8;
  cmMakefile *local_98;
  cmMakefile *subMf;
  cmStateDirectory local_68;
  undefined1 local_40 [8];
  cmStateSnapshot newSnapshot;
  bool immediate_local;
  bool excludeFromAll_local;
  string *binPath_local;
  string *srcPath_local;
  cmMakefile *this_local;
  
  newSnapshot.Position.Position._6_1_ = immediate;
  newSnapshot.Position.Position._7_1_ = excludeFromAll;
  bVar1 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar1) {
    this_00 = GetState(this);
    cmState::CreateBuildsystemDirectorySnapshot
              ((cmStateSnapshot *)local_40,this_00,&this->StateSnapshot);
    cmStateSnapshot::GetDirectory(&local_68,(cmStateSnapshot *)local_40);
    cmStateDirectory::SetCurrentSource(&local_68,srcPath);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&subMf,(cmStateSnapshot *)local_40);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&subMf,binPath);
    cmsys::SystemTools::MakeDirectory(binPath,(mode_t *)0x0);
    pcVar2 = (cmMakefile *)operator_new(0x7e8);
    cmMakefile(pcVar2,this->GlobalGenerator,(cmStateSnapshot *)local_40);
    local_98 = pcVar2;
    this_01 = GetGlobalGenerator(this);
    cmGlobalGenerator::AddMakefile(this_01,local_98);
    local_ca = 0;
    local_cb = 0;
    local_121 = true;
    if ((newSnapshot.Position.Position._7_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      local_ca = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"EXCLUDE_FROM_ALL",&local_c9);
      local_cb = 1;
      local_121 = GetPropertyAsBool(this,&local_c8);
    }
    if ((local_cb & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if ((local_ca & 1) != 0) {
      std::allocator<char>::~allocator(&local_c9);
    }
    pcVar2 = local_98;
    if (local_121 != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"EXCLUDE_FROM_ALL",&local_f1);
      SetProperty(pcVar2,&local_f0,"TRUE");
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
    }
    if ((newSnapshot.Position.Position._6_1_ & 1) == 0) {
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                (&this->UnConfiguredDirectories,&local_98);
    }
    else {
      ConfigureSubDirectory(this,local_98);
    }
    this_02 = (cmInstallSubdirectoryGenerator *)operator_new(0xe8);
    pcVar2 = local_98;
    binaryDirectory = (char *)std::__cxx11::string::c_str();
    cmInstallSubdirectoryGenerator::cmInstallSubdirectoryGenerator
              (this_02,pcVar2,binaryDirectory,(bool)(newSnapshot.Position.Position._7_1_ & 1));
    AddInstallGenerator(this,(cmInstallGenerator *)this_02);
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll, bool immediate)
{
  // Make sure the binary directory is unique.
  if (!this->EnforceUniqueDir(srcPath, binPath)) {
    return;
  }

  cmStateSnapshot newSnapshot =
    this->GetState()->CreateBuildsystemDirectorySnapshot(this->StateSnapshot);

  newSnapshot.GetDirectory().SetCurrentSource(srcPath);
  newSnapshot.GetDirectory().SetCurrentBinary(binPath);

  cmSystemTools::MakeDirectory(binPath);

  cmMakefile* subMf = new cmMakefile(this->GlobalGenerator, newSnapshot);
  this->GetGlobalGenerator()->AddMakefile(subMf);

  if (excludeFromAll || this->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }

  if (immediate) {
    this->ConfigureSubDirectory(subMf);
  } else {
    this->UnConfiguredDirectories.push_back(subMf);
  }

  this->AddInstallGenerator(new cmInstallSubdirectoryGenerator(
    subMf, binPath.c_str(), excludeFromAll));
}